

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

void Cnf_DataFree(Cnf_Dat_t *p)

{
  Cnf_Dat_t *p_local;
  
  if (p != (Cnf_Dat_t *)0x0) {
    Vec_IntFreeP(&p->vMapping);
    if (p->pClaPols != (uchar *)0x0) {
      free(p->pClaPols);
      p->pClaPols = (uchar *)0x0;
    }
    if (p->pObj2Clause != (int *)0x0) {
      free(p->pObj2Clause);
      p->pObj2Clause = (int *)0x0;
    }
    if (p->pObj2Count != (int *)0x0) {
      free(p->pObj2Count);
      p->pObj2Count = (int *)0x0;
    }
    if (*p->pClauses != (int *)0x0) {
      free(*p->pClauses);
      *p->pClauses = (int *)0x0;
    }
    if (p->pClauses != (int **)0x0) {
      free(p->pClauses);
      p->pClauses = (int **)0x0;
    }
    if (p->pVarNums != (int *)0x0) {
      free(p->pVarNums);
      p->pVarNums = (int *)0x0;
    }
    if (p != (Cnf_Dat_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Cnf_DataFree( Cnf_Dat_t * p )
{
    if ( p == NULL )
        return;
    Vec_IntFreeP( &p->vMapping );
    ABC_FREE( p->pClaPols );
    ABC_FREE( p->pObj2Clause );
    ABC_FREE( p->pObj2Count );
    ABC_FREE( p->pClauses[0] );
    ABC_FREE( p->pClauses );
    ABC_FREE( p->pVarNums );
    ABC_FREE( p );
}